

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O0

RpcSystem<capnp::rpc::twoparty::VatId> __thiscall
capnp::
makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
          (capnp *this,
          VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>
          *network)

{
  Impl *extraout_RDX;
  RpcSystem<capnp::rpc::twoparty::VatId> RVar1;
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  local_50;
  Maybe<capnp::Capability::Client> local_30;
  VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>
  *local_18;
  VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>
  *network_local;
  
  local_18 = network;
  network_local =
       (VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>
        *)this;
  kj::Maybe<capnp::Capability::Client>::Maybe(&local_30,(void *)0x0);
  kj::
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  ::Maybe(&local_50,(void *)0x0);
  RpcSystem<capnp::rpc::twoparty::VatId>::
  RpcSystem<capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((RpcSystem<capnp::rpc::twoparty::VatId> *)this,network,&local_30,&local_50);
  kj::
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  ::~Maybe(&local_50);
  kj::Maybe<capnp::Capability::Client>::~Maybe(&local_30);
  RVar1.super_RpcSystemBase.impl.ptr = extraout_RDX;
  RVar1.super_RpcSystemBase.impl.disposer = (Disposer *)this;
  return (RpcSystem<capnp::rpc::twoparty::VatId>)RVar1.super_RpcSystemBase.impl;
}

Assistant:

RpcSystem<VatId> makeRpcClient(
    VatNetwork<VatId, ProvisionId, RecipientId, ThirdPartyCapId, JoinResult>& network) {
  return RpcSystem<VatId>(network, nullptr);
}